

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O3

int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t size;
  
  switch(ud->type) {
  case '\x02':
    iVar2 = flatcc_verify_union_table(ud,Fantasy_Attacker_verify_table);
    return iVar2;
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
    return 0;
  case '\b':
    size = 8;
    break;
  case '\t':
  case '\n':
    size = 4;
    break;
  case '\v':
    iVar2 = flatcc_verify_union_string(ud);
    return iVar2;
  default:
    if (ud->type != 0xff) {
      return 0;
    }
    uVar3 = ud->offset + ud->base;
    iVar2 = 0x11;
    if (ud->base < uVar3) {
      if ((uVar3 & 3) == 0 && (ulong)uVar3 + 4 <= (ulong)ud->end) {
        uVar1 = *(uint *)((long)ud->buf + (ulong)uVar3);
        iVar2 = 8;
        if (uVar1 < ud->end - (uVar3 + 4)) {
          iVar2 = 7;
          if (*(char *)((long)ud->buf + (ulong)uVar1 + (ulong)(uVar3 + 4)) == '\0') {
            iVar2 = 0;
          }
        }
      }
    }
    return iVar2;
  }
  iVar2 = flatcc_verify_union_struct(ud,size,4);
  return iVar2;
}

Assistant:

static int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)
{
    switch (ud->type) {
    case 2: return flatcc_verify_union_table(ud, Fantasy_Attacker_verify_table); /* MuLan */
    case 8: return flatcc_verify_union_struct(ud, 8, 4); /* Rapunzel */
    case 9: return flatcc_verify_union_struct(ud, 4, 4); /* Belle */
    case 10: return flatcc_verify_union_struct(ud, 4, 4); /* BookFan */
    case 11: return flatcc_verify_union_string(ud); /* Other */
    case 255: return flatcc_verify_union_string(ud); /* Unused */
    default: return flatcc_verify_ok;
    }
}